

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O0

void testStringVectorHelper(exr_context_t f)

{
  exr_result_t eVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  ostream *poVar5;
  exr_result_t _test_rv_46;
  exr_result_t _test_rv_45;
  exr_result_t _test_rv_44;
  exr_result_t _test_rv_43;
  exr_result_t _test_rv_42;
  exr_result_t _test_rv_41;
  exr_result_t _test_rv_40;
  exr_result_t _test_rv_39;
  exr_result_t _test_rv_38;
  exr_result_t _test_rv_37;
  exr_result_t _test_rv_36;
  exr_result_t _test_rv_35;
  exr_result_t _test_rv_34;
  exr_result_t _test_rv_33;
  exr_result_t _test_rv_32;
  exr_result_t _test_rv_31;
  exr_result_t _test_rv_30;
  exr_result_t _test_rv_29;
  exr_result_t _test_rv_28;
  exr_result_t _test_rv_27;
  exr_result_t _test_rv_26;
  exr_attr_string_vector_t sv2;
  exr_result_t _test_rv_25;
  exr_result_t _test_rv_24;
  exr_result_t _test_rv_23;
  exr_result_t _test_rv_22;
  exr_result_t _test_rv_21;
  exr_result_t _test_rv_20;
  exr_result_t _test_rv_19;
  exr_result_t _test_rv_18;
  exr_result_t _test_rv_17;
  exr_result_t _test_rv_16;
  exr_result_t _test_rv_15;
  exr_result_t _test_rv_14;
  exr_result_t _test_rv_13;
  exr_result_t _test_rv_12;
  exr_result_t _test_rv_11;
  exr_result_t _test_rv_10;
  exr_result_t _test_rv_9;
  exr_result_t _test_rv_8;
  exr_result_t _test_rv_7;
  exr_result_t _test_rv_6;
  exr_result_t _test_rv_5;
  exr_result_t _test_rv_4;
  exr_result_t _test_rv_3;
  exr_result_t _test_rv_2;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  exr_attr_string_vector_t nil;
  exr_attr_string_vector_t sv;
  char *in_stack_fffffffffffffcb8;
  exr_attr_string_vector_t *in_stack_fffffffffffffcc0;
  uint line;
  exr_context_t in_stack_fffffffffffffcc8;
  exr_context_t in_stack_fffffffffffffcd0;
  exr_context_t in_stack_fffffffffffffcd8;
  exr_attr_string_vector_t *in_stack_fffffffffffffce0;
  exr_context_t in_stack_fffffffffffffce8;
  exr_attr_string_vector_t *in_stack_fffffffffffffcf0;
  exr_context_t in_stack_fffffffffffffcf8;
  int local_a0;
  int local_9c;
  int *local_98;
  undefined1 local_28 [16];
  int local_18;
  int local_14;
  int *local_10;
  
  memset(local_28,0,0x10);
  eVar1 = exr_attr_string_vector_init
                    (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                     (int32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  if (eVar1 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_destroy
                    (in_stack_fffffffffffffcd8,(exr_attr_string_vector_t *)in_stack_fffffffffffffcd0
                    );
  if (eVar1 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_init
                    (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                     (int32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_destroy
                    (in_stack_fffffffffffffcd8,(exr_attr_string_vector_t *)in_stack_fffffffffffffcd0
                    );
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_destroy
                    (in_stack_fffffffffffffcd8,(exr_attr_string_vector_t *)in_stack_fffffffffffffcd0
                    );
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_init
                    (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                     (int32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_init
                    (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                     (int32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  set_malloc_fail_on(1);
  eVar1 = exr_attr_string_vector_init
                    (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                     (int32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  set_malloc_fail_off();
  if (eVar1 != 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_init_entry
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (int32_t)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                     (int32_t)in_stack_fffffffffffffcb8);
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_init_entry
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (int32_t)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                     (int32_t)in_stack_fffffffffffffcb8);
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_init_entry
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (int32_t)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                     (int32_t)in_stack_fffffffffffffcb8);
  if (eVar1 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_init
                    (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                     (int32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  if (local_18 != 1) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  if (local_14 != 1) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  if (local_10 == (int *)0x0) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_init_entry
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (int32_t)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                     (int32_t)in_stack_fffffffffffffcb8);
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_init_entry
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (int32_t)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                     (int32_t)in_stack_fffffffffffffcb8);
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_init_entry
                    (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                     (int32_t)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                     (int32_t)in_stack_fffffffffffffcb8);
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_set_entry_with_length
                    (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                     (int32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (char *)in_stack_fffffffffffffce0,
                     (int32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_set_entry_with_length
                    (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                     (int32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (char *)in_stack_fffffffffffffce0,
                     (int32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_set_entry_with_length
                    (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                     (int32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (char *)in_stack_fffffffffffffce0,
                     (int32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_set_entry_with_length
                    (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                     (int32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (char *)in_stack_fffffffffffffce0,
                     (int32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_set_entry_with_length
                    (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                     (int32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (char *)in_stack_fffffffffffffce0,
                     (int32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
  if (eVar1 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_set_entry_with_length
                    (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                     (int32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (char *)in_stack_fffffffffffffce0,
                     (int32_t)((ulong)in_stack_fffffffffffffcd8 >> 0x20));
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_set_entry
                    (in_stack_fffffffffffffcd0,(exr_attr_string_vector_t *)in_stack_fffffffffffffcc8
                     ,(int32_t)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8)
  ;
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  if (*local_10 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  if (local_10[1] != 1) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  if (**(char **)(local_10 + 2) != '\0') {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_set_entry
                    (in_stack_fffffffffffffcd0,(exr_attr_string_vector_t *)in_stack_fffffffffffffcc8
                     ,(int32_t)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8)
  ;
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  if (*local_10 != 3) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  if (local_10[1] != 4) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  iVar2 = strcmp(*(char **)(local_10 + 2),"exr");
  if (iVar2 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20),in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_add_entry
                    (in_stack_fffffffffffffcd0,(exr_attr_string_vector_t *)in_stack_fffffffffffffcc8
                     ,(char *)in_stack_fffffffffffffcc0);
  line = (uint)((ulong)in_stack_fffffffffffffcc0 >> 0x20);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  if (local_18 != 2) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  if (local_14 != 2) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_add_entry_with_length
                    (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                     (char *)in_stack_fffffffffffffcd8,
                     (int32_t)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  if (eVar1 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_add_entry_with_length
                    (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                     (char *)in_stack_fffffffffffffcd8,
                     (int32_t)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  if (*local_10 != 3) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  if (local_10[1] != 4) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  iVar2 = strcmp(*(char **)(local_10 + 2),"exr");
  if (iVar2 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  if (local_10[4] != 7) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  if (local_10[5] != 8) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  iVar2 = strcmp(*(char **)(local_10 + 6),"openexr");
  if (iVar2 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_copy
                    (in_stack_fffffffffffffcd8,(exr_attr_string_vector_t *)in_stack_fffffffffffffcd0
                     ,(exr_attr_string_vector_t *)in_stack_fffffffffffffcc8);
  if (eVar1 != 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_copy
                    (in_stack_fffffffffffffcd8,(exr_attr_string_vector_t *)in_stack_fffffffffffffcd0
                     ,(exr_attr_string_vector_t *)in_stack_fffffffffffffcc8);
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_copy
                    (in_stack_fffffffffffffcd8,(exr_attr_string_vector_t *)in_stack_fffffffffffffcd0
                     ,(exr_attr_string_vector_t *)in_stack_fffffffffffffcc8);
  if (eVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  set_malloc_fail_on(1);
  eVar1 = exr_attr_string_vector_copy
                    (in_stack_fffffffffffffcd8,(exr_attr_string_vector_t *)in_stack_fffffffffffffcd0
                     ,(exr_attr_string_vector_t *)in_stack_fffffffffffffcc8);
  set_malloc_fail_off();
  if (eVar1 != 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  set_malloc_fail_on(2);
  eVar1 = exr_attr_string_vector_copy
                    (in_stack_fffffffffffffcd8,(exr_attr_string_vector_t *)in_stack_fffffffffffffcd0
                     ,(exr_attr_string_vector_t *)in_stack_fffffffffffffcc8);
  set_malloc_fail_off();
  if (eVar1 != 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_destroy
                    (in_stack_fffffffffffffcd8,(exr_attr_string_vector_t *)in_stack_fffffffffffffcd0
                    );
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_copy
                    (in_stack_fffffffffffffcd8,(exr_attr_string_vector_t *)in_stack_fffffffffffffcd0
                     ,(exr_attr_string_vector_t *)in_stack_fffffffffffffcc8);
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  if (local_a0 != 2) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  if (local_9c != 2) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  if (*local_98 != 3) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  if (local_98[1] != 4) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  iVar2 = strcmp(*(char **)(local_98 + 2),"exr");
  if (iVar2 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  if (local_98[4] != 7) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  if (local_98[5] != 8) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  iVar2 = strcmp(*(char **)(local_98 + 6),"openexr");
  if (iVar2 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_destroy
                    (in_stack_fffffffffffffcd8,(exr_attr_string_vector_t *)in_stack_fffffffffffffcd0
                    );
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_init
                    (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                     (int32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_add_entry_with_length
                    (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                     (char *)in_stack_fffffffffffffcd8,
                     (int32_t)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_add_entry_with_length
                    (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                     (char *)in_stack_fffffffffffffcd8,
                     (int32_t)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_add_entry_with_length
                    (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                     (char *)in_stack_fffffffffffffcd8,
                     (int32_t)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_add_entry_with_length
                    (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                     (char *)in_stack_fffffffffffffcd8,
                     (int32_t)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_add_entry_with_length
                    (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                     (char *)in_stack_fffffffffffffcd8,
                     (int32_t)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  if (local_a0 != 5) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_destroy
                    (in_stack_fffffffffffffcd8,(exr_attr_string_vector_t *)in_stack_fffffffffffffcd0
                    );
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    in_stack_fffffffffffffcf8 = (exr_context_t)std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffcf8,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_init
                    (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                     (int32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    in_stack_fffffffffffffcf0 = (exr_attr_string_vector_t *)std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffcf0,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  set_malloc_fail_on(1);
  eVar1 = exr_attr_string_vector_add_entry_with_length
                    (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                     (char *)in_stack_fffffffffffffcd8,
                     (int32_t)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
  set_malloc_fail_off();
  if (eVar1 != 1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    in_stack_fffffffffffffce0 = (exr_attr_string_vector_t *)std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffce0,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    in_stack_fffffffffffffce8 = (exr_context_t)std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(1);
    poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffce8,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_destroy
                    (in_stack_fffffffffffffcd8,(exr_attr_string_vector_t *)in_stack_fffffffffffffcd0
                    );
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    in_stack_fffffffffffffcd8 = (exr_context_t)std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffcd8,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  if (local_18 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  if (local_14 != 0) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  if (local_10 != (int *)0x0) {
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_destroy
                    (in_stack_fffffffffffffcd8,(exr_attr_string_vector_t *)in_stack_fffffffffffffcd0
                    );
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    in_stack_fffffffffffffcd0 = (exr_context_t)std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffcd0,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_init
                    (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                     (int32_t)((ulong)in_stack_fffffffffffffce8 >> 0x20));
  if ((eVar1 == 0) &&
     (eVar1 = exr_attr_string_vector_add_entry_with_length
                        (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                         (char *)in_stack_fffffffffffffcd8,
                         (int32_t)((ulong)in_stack_fffffffffffffcd0 >> 0x20)), eVar1 != 1)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar5 = std::operator<<(poVar3,pcVar4);
    line = (uint)((ulong)poVar3 >> 0x20);
    poVar3 = std::operator<<(poVar5,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
    in_stack_fffffffffffffcc8 = (exr_context_t)std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(1);
    poVar3 = std::operator<<((ostream *)in_stack_fffffffffffffcc8,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   in_stack_fffffffffffffcb8);
  }
  eVar1 = exr_attr_string_vector_destroy
                    (in_stack_fffffffffffffcd8,(exr_attr_string_vector_t *)in_stack_fffffffffffffcd0
                    );
  if (eVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(eVar1);
    poVar5 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,line,
                   (char *)poVar3);
  }
  return;
}

Assistant:

static void
testStringVectorHelper (exr_context_t f)
{
    // TODO: Find a good way to test adding until we grow past the memory limit (i.e. INT32_MAX/2 entries)
    exr_attr_string_vector_t sv, nil = {0};
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_init (NULL, &sv, 4));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_destroy (NULL, &sv));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_vector_init (f, NULL, 4));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, NULL));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &nil));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_vector_init (f, &sv, -4));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init (f, &sv, INT32_MAX / 2));
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY, exr_attr_string_vector_init (f, &sv, 1));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init_entry (f, NULL, 0, 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init_entry (f, &nil, 0, 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_init_entry (NULL, &nil, 0, 3));

    EXRCORE_TEST_RVAL (exr_attr_string_vector_init (f, &sv, 1));
    EXRCORE_TEST (sv.n_strings == 1);
    EXRCORE_TEST (sv.alloc_size == 1);
    EXRCORE_TEST (sv.strings != NULL);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init_entry (f, &sv, -1, 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init_entry (f, &sv, 0, -3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_init_entry (f, &sv, 1, 3));

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_set_entry_with_length (f, &sv, -1, NULL, -1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_set_entry_with_length (f, &sv, -1, "exr", 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_set_entry_with_length (f, &sv, 0, NULL, -1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_set_entry_with_length (f, &sv, 1, NULL, -1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_set_entry_with_length (NULL, &sv, 1, NULL, -1));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_set_entry_with_length (f, NULL, 1, NULL, -1));

    EXRCORE_TEST_RVAL (exr_attr_string_vector_set_entry (f, &sv, 0, NULL));
    EXRCORE_TEST (sv.strings[0].length == 0);
    EXRCORE_TEST (sv.strings[0].alloc_size == 1);
    EXRCORE_TEST (sv.strings[0].str[0] == '\0');
    EXRCORE_TEST_RVAL (exr_attr_string_vector_set_entry (f, &sv, 0, "exr"));
    EXRCORE_TEST (sv.strings[0].length == 3);
    EXRCORE_TEST (sv.strings[0].alloc_size == 4);
    EXRCORE_TEST (0 == strcmp (sv.strings[0].str, "exr"));

    EXRCORE_TEST_RVAL (exr_attr_string_vector_add_entry (f, &sv, "openexr"));
    EXRCORE_TEST (sv.n_strings == 2);
    EXRCORE_TEST (sv.alloc_size == 2);

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_add_entry_with_length (NULL, &sv, "foo", 3));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_attr_string_vector_add_entry_with_length (f, NULL, "foo", 3));
    EXRCORE_TEST (sv.strings[0].length == 3);
    EXRCORE_TEST (sv.strings[0].alloc_size == 4);
    EXRCORE_TEST (0 == strcmp (sv.strings[0].str, "exr"));
    EXRCORE_TEST (sv.strings[1].length == 7);
    EXRCORE_TEST (sv.strings[1].alloc_size == 8);
    EXRCORE_TEST (0 == strcmp (sv.strings[1].str, "openexr"));
    exr_attr_string_vector_t sv2;
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_MISSING_CONTEXT_ARG,
        exr_attr_string_vector_copy (NULL, &sv2, &sv));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_vector_copy (f, &sv2, NULL));
    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT, exr_attr_string_vector_copy (f, NULL, &sv));
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY, exr_attr_string_vector_copy (f, &sv2, &sv));
    EXRCORE_TEST_RVAL_FAIL_MALLOC_AFTER (
        1, EXR_ERR_OUT_OF_MEMORY, exr_attr_string_vector_copy (f, &sv2, &sv));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv2));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_copy (f, &sv2, &sv));
    EXRCORE_TEST (sv2.n_strings == 2);
    EXRCORE_TEST (sv2.alloc_size == 2);

    EXRCORE_TEST (sv2.strings[0].length == 3);
    EXRCORE_TEST (sv2.strings[0].alloc_size == 4);
    EXRCORE_TEST (0 == strcmp (sv2.strings[0].str, "exr"));
    EXRCORE_TEST (sv2.strings[1].length == 7);
    EXRCORE_TEST (sv2.strings[1].alloc_size == 8);
    EXRCORE_TEST (0 == strcmp (sv2.strings[1].str, "openexr"));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv2));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_init (f, &sv2, 0));
    EXRCORE_TEST_RVAL (
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "foo", 3));
    EXRCORE_TEST_RVAL (
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "bar", 3));
    EXRCORE_TEST_RVAL (
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "baz", 3));
    EXRCORE_TEST_RVAL (
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "frob", 4));
    EXRCORE_TEST_RVAL (
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "nitz", 4));
    EXRCORE_TEST (sv2.n_strings == 5);
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv2));
    EXRCORE_TEST_RVAL (exr_attr_string_vector_init (f, &sv2, 0));
    EXRCORE_TEST_RVAL_FAIL_MALLOC (
        EXR_ERR_OUT_OF_MEMORY,
        exr_attr_string_vector_add_entry_with_length (f, &sv2, "foo", 3));

    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv));
    EXRCORE_TEST (sv.n_strings == 0);
    EXRCORE_TEST (sv.alloc_size == 0);
    EXRCORE_TEST (sv.strings == NULL);
    // make sure we can re-delete something?
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv));

    // might be on a low memory machine, in which case just skip the test
    if (EXR_ERR_SUCCESS ==
        exr_attr_string_vector_init (
            f, &sv, (int) (INT32_MAX / (int) sizeof (exr_attr_string_t))))
    {
        EXRCORE_TEST_RVAL_FAIL (
            EXR_ERR_OUT_OF_MEMORY,
            exr_attr_string_vector_add_entry_with_length (f, &sv, "exr", 3));
    }
    EXRCORE_TEST_RVAL (exr_attr_string_vector_destroy (f, &sv));
}